

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SqlGenerator.cpp
# Opt level: O0

void __thiscall
SqlGenerator::generateCode(SqlGenerator *this,bool hasApplicationHandler,bool hasDynamicFunctions)

{
  SqlGenerator *in_stack_00000390;
  SqlGenerator *in_stack_000004b0;
  SqlGenerator *in_stack_000005f0;
  SqlGenerator *in_stack_00000850;
  SqlGenerator *in_stack_00000da0;
  
  generateLoadQuery(in_stack_000005f0);
  generateJoinQuery(in_stack_00000390);
  generateLmfaoQuery(in_stack_00000850);
  generateAggregateQueries(in_stack_00000da0);
  generateOutputQueries(in_stack_000004b0);
  return;
}

Assistant:

void SqlGenerator::generateCode(bool hasApplicationHandler,
                                bool hasDynamicFunctions)
{
    DINFO("Starting SQL - Generator \n");

    hasApplicationHandler = true;
    hasDynamicFunctions = true;
    
    generateLoadQuery();
    generateJoinQuery();
    generateLmfaoQuery();
    generateAggregateQueries();
    generateOutputQueries();
}